

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

FaceData * __thiscall
Ptex::v2_2::PtexReader::getFace(PtexReader *this,int levelid,Level *level,int faceid,Res res)

{
  FaceData **face_00;
  pointer ppFVar1;
  FaceData *pFVar2;
  FaceData **face;
  
  ppFVar1 = (level->faces).
            super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar2 = ppFVar1[faceid];
  if (pFVar2 != (FaceData *)0x0) {
    return pFVar2;
  }
  face_00 = ppFVar1 + faceid;
  readFaceData(this,(level->offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start[faceid],
               (FaceDataHeader)
               (level->fdh).
               super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
               ._M_impl.super__Vector_impl_data._M_start[faceid].data,res,levelid,face_00);
  return *face_00;
}

Assistant:

FaceData* getFace(int levelid, Level* level, int faceid, Res res)
    {
        FaceData*& face = level->faces[faceid];
        if (!face) readFace(levelid, level, faceid, res);
        return face;
    }